

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int robust_open(char *z,int f,mode_t m)

{
  int iVar1;
  int *piVar2;
  mode_t local_b4;
  undefined1 local_b0 [8];
  stat statbuf;
  mode_t m2;
  int fd;
  mode_t m_local;
  int f_local;
  char *z_local;
  
  local_b4 = m;
  if (m == 0) {
    local_b4 = 0x1a4;
  }
  statbuf.__glibc_reserved[2]._0_4_ = local_b4;
  do {
    while (statbuf.__glibc_reserved[2]._4_4_ =
                (*aSyscall[0].pCurrent)
                          (z,(ulong)(f | 0x80000),(ulong)(mode_t)statbuf.__glibc_reserved[2]),
          (int)statbuf.__glibc_reserved[2]._4_4_ < 0) {
      piVar2 = __errno_location();
      if (*piVar2 != 4) goto LAB_001dbbb3;
    }
    if (2 < (int)statbuf.__glibc_reserved[2]._4_4_) break;
    (*aSyscall[1].pCurrent)((ulong)statbuf.__glibc_reserved[2]._4_4_);
    sqlite3_log(0x1c,"attempt to open \"%s\" as file descriptor %d",z,
                (ulong)statbuf.__glibc_reserved[2]._4_4_);
    statbuf.__glibc_reserved[2]._4_4_ = 0xffffffff;
    iVar1 = (*aSyscall[0].pCurrent)("/dev/null",(ulong)(uint)f,(ulong)m);
  } while (-1 < iVar1);
LAB_001dbbb3:
  if ((((-1 < (int)statbuf.__glibc_reserved[2]._4_4_) && (m != 0)) &&
      (iVar1 = (*aSyscall[5].pCurrent)((ulong)statbuf.__glibc_reserved[2]._4_4_,local_b0),
      iVar1 == 0)) && ((statbuf.st_rdev == 0 && (((uint)statbuf.st_nlink & 0x1ff) != m)))) {
    (*aSyscall[0xe].pCurrent)((ulong)statbuf.__glibc_reserved[2]._4_4_,(ulong)m);
  }
  return statbuf.__glibc_reserved[2]._4_4_;
}

Assistant:

static int robust_open(const char *z, int f, mode_t m){
  int fd;
  mode_t m2 = m ? m : SQLITE_DEFAULT_FILE_PERMISSIONS;
  while(1){
#if defined(O_CLOEXEC)
    fd = osOpen(z,f|O_CLOEXEC,m2);
#else
    fd = osOpen(z,f,m2);
#endif
    if( fd<0 ){
      if( errno==EINTR ) continue;
      break;
    }
    if( fd>=SQLITE_MINIMUM_FILE_DESCRIPTOR ) break;
    osClose(fd);
    sqlite3_log(SQLITE_WARNING, 
                "attempt to open \"%s\" as file descriptor %d", z, fd);
    fd = -1;
    if( osOpen("/dev/null", f, m)<0 ) break;
  }
  if( fd>=0 ){
    if( m!=0 ){
      struct stat statbuf;
      if( osFstat(fd, &statbuf)==0 
       && statbuf.st_size==0
       && (statbuf.st_mode&0777)!=m 
      ){
        osFchmod(fd, m);
      }
    }
#if defined(FD_CLOEXEC) && (!defined(O_CLOEXEC) || O_CLOEXEC==0)
    osFcntl(fd, F_SETFD, osFcntl(fd, F_GETFD, 0) | FD_CLOEXEC);
#endif
  }
  return fd;
}